

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::MergeScenes
               (aiScene **_dest,aiScene *master,
               vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *srcList,
               uint flags)

{
  int *__src;
  _Rb_tree_header *p_Var1;
  ai_uint32 aVar2;
  aiMaterialProperty *paVar3;
  int *piVar4;
  aiNode *paVar5;
  aiBone *name;
  aiLight *paVar6;
  aiCamera *paVar7;
  aiNodeAnim *name_00;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *pvVar8;
  char cVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  aiScene *paVar13;
  pointer pAVar14;
  aiTexture **_dest_00;
  aiMaterial **_dest_01;
  Logger *pLVar15;
  aiScene *paVar16;
  aiMesh **_dest_02;
  aiMesh *paVar17;
  aiCamera **ppaVar18;
  aiLight *__dest;
  aiCamera *__dest_00;
  aiAnimation *paVar19;
  size_t sVar20;
  pointer pSVar21;
  uint uVar22;
  aiMaterial *paVar23;
  pointer pSVar24;
  uint uVar25;
  ulong uVar26;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *hashes;
  char *pcVar27;
  pointer pNVar28;
  ulong uVar29;
  uint uVar30;
  char *pcVar32;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  pointer pSVar36;
  aiAnimation **ppaVar37;
  long lVar38;
  bool bVar39;
  bool bVar40;
  vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> src;
  vector<unsigned_int,_std::allocator<unsigned_int>_> duplicates;
  vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_> nodes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offset;
  aiNode *node;
  vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> local_280;
  char *local_268;
  aiScene *local_260;
  aiNode *local_258;
  aiAnimation **local_250;
  char *local_248;
  aiLight **local_240;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *local_220;
  vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_> local_218;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_200;
  aiScene *local_1e8;
  aiCamera **local_1e0;
  aiNode *local_1d8 [2];
  undefined1 local_1c8 [24];
  ulong local_1b0;
  NodeAttachmentInfo local_1a8;
  char acStack_188 [4];
  uint uStack_184;
  char local_180 [8];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_178;
  ios_base local_138 [264];
  ulong uVar31;
  
  if (_dest != (aiScene **)0x0) {
    paVar13 = *_dest;
    local_220 = srcList;
    if ((srcList->
        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>)._M_impl
        .super__Vector_impl_data._M_start ==
        (srcList->
        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>)._M_impl
        .super__Vector_impl_data._M_finish) {
      if (paVar13 != (aiScene *)0x0) {
        CopySceneFlat(_dest,master);
        return;
      }
      *_dest = master;
    }
    else {
      local_1e8 = master;
      if (paVar13 == (aiScene *)0x0) {
        paVar13 = (aiScene *)operator_new(0x80);
        aiScene::aiScene(paVar13);
        *_dest = paVar13;
      }
      else {
        aiScene::~aiScene(paVar13);
        aiScene::aiScene(*_dest);
        paVar13 = *_dest;
      }
      pvVar8 = local_220;
      local_260 = paVar13;
      std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::vector
                (&local_280,
                 ((long)(local_220->
                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_220->
                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4) + 1,
                 (allocator_type *)&local_1a8);
      (local_280.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
       _M_impl.super__Vector_impl_data._M_start)->scene = local_1e8;
      pAVar14 = (pvVar8->
                super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar8->
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>).
          _M_impl.super__Vector_impl_data._M_finish != pAVar14) {
        p_Var1 = &local_178._M_impl.super__Rb_tree_header;
        uVar22 = 1;
        uVar29 = 0;
        do {
          pSVar21 = local_280.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_1a8.node = (aiNode *)pAVar14[uVar29].scene;
          local_180[0] = '\0';
          local_180[1] = '\0';
          local_180[2] = '\0';
          local_180[3] = '\0';
          local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1a8.attachToNode = (aiNode *)((ulong)local_1a8.attachToNode & 0xffffffffffffff00);
          uVar29 = (ulong)uVar22;
          this = &local_280.
                  super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar29].hashes;
          *(ulong *)(((SceneHelper *)(this + -1))->id + 8) =
               CONCAT71(local_1a8._17_7_,local_1a8.resolved);
          *(ulong *)(((SceneHelper *)(this + -1))->id + 0x10) =
               CONCAT44(local_1a8.src_idx._4_4_,(uint)local_1a8.src_idx);
          *(ulong *)(((SceneHelper *)(this + -1))->id + 0x14) =
               CONCAT44(acStack_188,local_1a8.src_idx._4_4_);
          *(ulong *)(((SceneHelper *)(this + -1))->id + 0x1c) = (ulong)uStack_184;
          ((SceneHelper *)(this + -1))->scene = (aiScene *)local_1a8.node;
          *(aiNode **)((SceneHelper *)(this + -1))->id = local_1a8.attachToNode;
          local_178._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_178._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::clear(&this->_M_t);
          if (local_178._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            pSVar21[uVar29].hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 local_178._M_impl.super__Rb_tree_header._M_header._M_color;
            pSVar21[uVar29].hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 local_178._M_impl.super__Rb_tree_header._M_header._M_parent;
            pSVar21[uVar29].hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 local_178._M_impl.super__Rb_tree_header._M_header._M_left;
            pSVar21[uVar29].hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_178._M_impl.super__Rb_tree_header._M_header._M_right;
            (local_178._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                 &pSVar21[uVar29].hashes._M_t._M_impl.super__Rb_tree_header._M_header;
            pSVar21[uVar29].hashes._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 local_178._M_impl.super__Rb_tree_header._M_node_count;
            local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_178._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
            local_178._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          }
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_178);
          pAVar14 = (local_220->
                    super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar22 = uVar22 + 1;
        } while (uVar29 < (ulong)((long)(local_220->
                                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar14
                                 >> 4));
      }
      local_1a8.node = (aiNode *)CONCAT44(local_1a8.node._4_4_,0xffffffff);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_238,
                 ((long)local_280.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_280.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
                 (value_type_conflict1 *)&local_1a8,(allocator_type *)local_1d8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_200,
                 ((long)local_280.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_280.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
                 (allocator_type *)&local_1a8);
      if (local_280.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_280.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar29 = 0;
        do {
          uVar22 = (uint)uVar29;
          if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar29] == 0xffffffff ||
              local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar29] == uVar22) {
            local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar29] = uVar22;
            uVar33 = (ulong)(uVar22 + 1);
            uVar26 = ((long)local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
            if (uVar33 <= uVar26 && uVar26 - uVar33 != 0) {
              uVar30 = uVar22 + 2;
              uVar34 = uVar33;
              do {
                uVar31 = (ulong)uVar30;
                if (local_280.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar29].scene ==
                    local_280.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar34].scene) {
                  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar34] = uVar22;
                }
                uVar26 = ((long)local_280.
                                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_280.
                                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) *
                         -0x5555555555555555;
                uVar30 = uVar30 + 1;
                uVar34 = uVar31;
              } while (uVar31 <= uVar26 && uVar26 - uVar31 != 0);
            }
          }
          else {
            uVar33 = (ulong)(uVar22 + 1);
            uVar26 = ((long)local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
          }
          uVar29 = uVar33;
        } while (uVar33 < uVar26);
      }
      if (((flags & 1) != 0) &&
         (1 < (ulong)(((long)local_280.
                             super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_280.
                             super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555))
         ) {
        uVar29 = 1;
        do {
          uVar22 = snprintf(local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar29].id,0x20,"$%.6X$_",
                            uVar29);
          local_280.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar29].idlen = uVar22;
          if ((flags & 0x10) != 0) {
            AddNodeHashes((SceneCombiner *)
                          (local_280.
                           super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar29].scene)->mRootNode,
                          (aiNode *)
                          &local_280.
                           super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar29].hashes,hashes);
            paVar13 = local_280.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar29].scene;
            if (paVar13->mNumAnimations != 0) {
              uVar33 = 0;
              do {
                pSVar21 = local_280.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar22 = (paVar13->mAnimations[uVar33]->mName).length;
                pcVar32 = (paVar13->mAnimations[uVar33]->mName).data;
                if (uVar22 == 0) {
                  sVar20 = strlen(pcVar32);
                  uVar22 = (uint)sVar20;
                }
                uVar30 = 0;
                if (3 < uVar22) {
                  uVar25 = uVar22 >> 2;
                  uVar30 = 0;
                  do {
                    uVar30 = (*(ushort *)pcVar32 + uVar30) * 0x10000 ^
                             (uint)*(ushort *)(pcVar32 + 2) << 0xb ^ *(ushort *)pcVar32 + uVar30;
                    pcVar32 = pcVar32 + 4;
                    uVar30 = (uVar30 >> 0xb) + uVar30;
                    uVar25 = uVar25 - 1;
                  } while (uVar25 != 0);
                }
                switch(uVar22 & 3) {
                case 1:
                  uVar22 = (uVar30 + (int)*pcVar32) * 0x400 ^ uVar30 + (int)*pcVar32;
                  uVar30 = uVar22 >> 1;
                  goto LAB_003b2e10;
                case 2:
                  uVar22 = (uVar30 + *(ushort *)pcVar32) * 0x800 ^ uVar30 + *(ushort *)pcVar32;
                  uVar30 = uVar22 >> 0x11;
LAB_003b2e10:
                  uVar30 = uVar30 + uVar22;
                  break;
                case 3:
                  uVar30 = (uVar30 + *(ushort *)pcVar32) * 0x10000 ^
                           (int)pcVar32[2] << 0x12 ^ uVar30 + *(ushort *)pcVar32;
                  uVar30 = (uVar30 >> 0xb) + uVar30;
                }
                uVar30 = uVar30 * 8 ^ uVar30;
                uVar30 = (uVar30 >> 5) + uVar30;
                uVar30 = uVar30 * 0x10 ^ uVar30;
                uVar30 = (uVar30 >> 0x11) + uVar30;
                uVar30 = uVar30 * 0x2000000 ^ uVar30;
                local_1a8.node = (aiNode *)CONCAT44(local_1a8.node._4_4_,(uVar30 >> 6) + uVar30);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::_M_insert_unique<unsigned_int>(&pSVar21[uVar29].hashes._M_t,(uint *)&local_1a8);
                uVar33 = uVar33 + 1;
                paVar13 = local_280.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar29].scene;
              } while (uVar33 < paVar13->mNumAnimations);
            }
          }
          uVar29 = (ulong)((int)uVar29 + 1);
          uVar33 = ((long)local_280.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_280.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
        } while (uVar29 <= uVar33 && uVar33 - uVar29 != 0);
      }
      paVar13 = local_260;
      pSVar21 = local_280.
                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar24 = local_280.
                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (local_280.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_280.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar22 = local_260->mNumAnimations;
        uVar30 = local_260->mNumLights;
        uVar25 = local_260->mNumCameras;
        uVar29 = 0;
        do {
          pSVar24 = local_280.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar29;
          if (((flags & 4) != 0) ||
             ((uint)uVar29 ==
              local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar29])) {
            local_260->mNumTextures = local_260->mNumTextures + pSVar24->scene->mNumTextures;
            local_260->mNumMaterials = local_260->mNumMaterials + pSVar24->scene->mNumMaterials;
            local_260->mNumMeshes = local_260->mNumMeshes + pSVar24->scene->mNumMeshes;
          }
          uVar30 = uVar30 + pSVar24->scene->mNumLights;
          local_260->mNumLights = uVar30;
          uVar25 = uVar25 + pSVar24->scene->mNumCameras;
          local_260->mNumCameras = uVar25;
          uVar22 = uVar22 + pSVar24->scene->mNumAnimations;
          local_260->mNumAnimations = uVar22;
          if ((pSVar24->scene->mFlags & 8) != 0) {
            *(byte *)&local_260->mFlags = (byte)local_260->mFlags | 8;
          }
          uVar29 = (ulong)((uint)uVar29 + 1);
          uVar33 = ((long)local_280.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_280.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
          pSVar24 = local_280.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        } while (uVar29 <= uVar33 && uVar33 - uVar29 != 0);
      }
      pSVar36 = pSVar24;
      if (local_260->mNumTextures != 0) {
        _dest_00 = (aiTexture **)operator_new__((ulong)local_260->mNumMaterials << 3);
        paVar13->mTextures = _dest_00;
        pSVar36 = pSVar21;
        if (pSVar24 != pSVar21) {
          uVar29 = 0;
          uVar33 = 0;
          do {
            paVar13 = pSVar21[uVar29].scene;
            if (paVar13->mNumTextures != 0) {
              uVar26 = 0;
              do {
                if ((uint)uVar29 ==
                    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar29]) {
                  *_dest_00 = paVar13->mTextures[uVar26];
LAB_003b2ffb:
                  _dest_00 = _dest_00 + 1;
                  paVar13 = pSVar21[uVar29].scene;
                }
                else if ((flags & 4) != 0) {
                  Copy(_dest_00,paVar13->mTextures[uVar26]);
                  goto LAB_003b2ffb;
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 < paVar13->mNumTextures);
            }
            local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar29] = (uint)uVar33;
            uVar33 = (ulong)((long)_dest_00 - (long)local_260->mTextures) >> 3;
            uVar29 = (ulong)((uint)uVar29 + 1);
            uVar26 = ((long)local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
            pSVar36 = local_280.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pSVar21 = local_280.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar29 <= uVar26 && uVar26 - uVar29 != 0);
        }
      }
      paVar13 = local_260;
      pSVar24 = pSVar36;
      if ((ulong)local_260->mNumMaterials != 0) {
        _dest_01 = (aiMaterial **)operator_new__((ulong)local_260->mNumMaterials << 3);
        paVar13->mMaterials = _dest_01;
        pSVar24 = pSVar21;
        if (pSVar36 != pSVar21) {
          uVar29 = 0;
          local_268 = (char *)0x0;
          do {
            paVar16 = pSVar21[uVar29].scene;
            if (paVar16->mNumMaterials != 0) {
              pSVar21 = pSVar21 + uVar29;
              local_248 = pSVar21->id;
              ppaVar37 = (aiAnimation **)0x0;
              do {
                if ((uint)uVar29 ==
                    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar29]) {
                  *_dest_01 = paVar16->mMaterials[(long)ppaVar37];
LAB_003b30ec:
                  paVar16 = pSVar21->scene;
                  if ((paVar16->mNumTextures != paVar13->mNumTextures) &&
                     (paVar23 = *_dest_01, paVar23->mNumProperties != 0)) {
                    uVar33 = 0;
                    local_250 = ppaVar37;
                    do {
                      paVar3 = paVar23->mProperties[uVar33];
                      pcVar32 = (paVar3->mKey).data;
                      iVar12 = strncmp(pcVar32,"$tex.file",9);
                      if (iVar12 == 0) {
                        pcVar32 = paVar3->mData;
                        if (pcVar32[4] == '*') {
                          cVar9 = pcVar32[5];
                          iVar12 = 0;
                          if (0xf5 < (byte)(cVar9 - 0x3aU)) {
                            pcVar27 = pcVar32 + 6;
                            iVar12 = 0;
                            do {
                              iVar12 = (uint)(byte)(cVar9 - 0x30) + iVar12 * 10;
                              cVar9 = *pcVar27;
                              pcVar27 = pcVar27 + 1;
                            } while (0xf5 < (byte)(cVar9 - 0x3aU));
                          }
                          iVar12 = iVar12 + local_200.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar29];
                          if (iVar12 < 0) {
                            pcVar32[5] = '-';
                            pcVar32 = pcVar32 + 6;
                            iVar12 = -iVar12;
                            uVar22 = 2;
                          }
                          else {
                            pcVar32 = pcVar32 + 5;
                            uVar22 = 1;
                          }
                          iVar35 = 1000000000;
                          bVar10 = false;
                          do {
                            bVar39 = (int)((long)iVar12 / (long)iVar35) != 0;
                            bVar40 = iVar35 == 1;
                            if ((bVar10 || bVar40) || bVar39) {
                              pcVar27 = pcVar32 + 1;
                              *pcVar32 = (char)((long)iVar12 / (long)iVar35) + '0';
                              pcVar32 = pcVar27;
                              if (iVar35 == 1) break;
                              uVar22 = uVar22 + 1;
                              iVar12 = iVar12 % iVar35;
                            }
                            iVar35 = iVar35 / 10;
                            bVar10 = (bool)(bVar10 | bVar40 | bVar39);
                          } while (uVar22 < 0x3ff);
                          *pcVar32 = '\0';
                        }
                      }
                      else {
                        iVar12 = strcmp(pcVar32,"$mat.name");
                        if (((flags & 2) != 0) && (iVar12 == 0)) {
                          piVar4 = (int *)paVar3->mData;
                          uVar22 = pSVar21->idlen;
                          iVar12 = *piVar4;
                          if ((iVar12 == 0) || ((char)piVar4[1] != '$')) {
                            if (iVar12 + uVar22 < 0x3ff) {
                              __src = piVar4 + 1;
                              memmove((void *)((ulong)uVar22 + (long)__src),__src,
                                      (ulong)(iVar12 + 1));
                              memcpy(__src,local_248,(ulong)uVar22);
                              *piVar4 = *piVar4 + uVar22;
                            }
                            else {
                              pLVar15 = DefaultLogger::get();
                              Logger::debug(pLVar15,
                                            "Can\'t add an unique prefix because the string is too long"
                                           );
                            }
                          }
                        }
                      }
                      uVar33 = uVar33 + 1;
                      paVar23 = *_dest_01;
                    } while (uVar33 < paVar23->mNumProperties);
                    paVar16 = pSVar21->scene;
                    ppaVar37 = local_250;
                    paVar13 = local_260;
                  }
                  _dest_01 = _dest_01 + 1;
                }
                else if ((flags & 4) != 0) {
                  Copy(_dest_01,paVar16->mMaterials[(long)ppaVar37]);
                  goto LAB_003b30ec;
                }
                ppaVar37 = (aiAnimation **)((long)ppaVar37 + 1);
              } while (ppaVar37 < (ulong)paVar16->mNumMaterials);
            }
            local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar29] = (uint)local_268;
            local_268 = (char *)((ulong)((long)_dest_01 - (long)paVar13->mMaterials) >> 3);
            uVar29 = (ulong)((uint)uVar29 + 1);
            uVar33 = ((long)local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
            pSVar24 = local_280.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pSVar21 = local_280.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar29 <= uVar33 && uVar33 - uVar29 != 0);
        }
      }
      if ((ulong)paVar13->mNumMeshes != 0) {
        _dest_02 = (aiMesh **)operator_new__((ulong)paVar13->mNumMeshes << 3);
        local_260->mMeshes = _dest_02;
        if (pSVar24 != pSVar21) {
          uVar29 = 0;
          uVar33 = 0;
          do {
            paVar13 = pSVar21[uVar29].scene;
            if (paVar13->mNumMeshes != 0) {
              uVar26 = 0;
              do {
                if ((uint)uVar29 ==
                    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar29]) {
                  paVar17 = paVar13->mMeshes[uVar26];
                  *_dest_02 = paVar17;
LAB_003b33a6:
                  paVar17->mMaterialIndex =
                       paVar17->mMaterialIndex +
                       local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar29];
                  _dest_02 = _dest_02 + 1;
                  paVar13 = pSVar21[uVar29].scene;
                }
                else if ((flags & 4) != 0) {
                  Copy(_dest_02,paVar13->mMeshes[uVar26]);
                  paVar17 = *_dest_02;
                  goto LAB_003b33a6;
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 < paVar13->mNumMeshes);
            }
            local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar29] = (uint)uVar33;
            uVar33 = (ulong)((long)_dest_02 - (long)local_260->mMeshes) >> 3;
            uVar29 = (ulong)((uint)uVar29 + 1);
            uVar26 = ((long)local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
            pSVar21 = local_280.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar29 <= uVar26 && uVar26 - uVar29 != 0);
        }
      }
      local_218.
      super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (NodeAttachmentInfo *)0x0;
      local_218.
      super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (NodeAttachmentInfo *)0x0;
      local_218.
      super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (NodeAttachmentInfo *)0x0;
      std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::reserve
                (&local_218,
                 (long)(local_220->
                       super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_220->
                       super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 4);
      paVar13 = local_260;
      if ((ulong)local_260->mNumLights == 0) {
        local_240 = (aiLight **)0x0;
      }
      else {
        local_240 = (aiLight **)operator_new__((ulong)local_260->mNumLights << 3);
      }
      paVar13->mLights = local_240;
      if ((ulong)paVar13->mNumCameras == 0) {
        ppaVar18 = (aiCamera **)0x0;
      }
      else {
        ppaVar18 = (aiCamera **)operator_new__((ulong)paVar13->mNumCameras << 3);
      }
      paVar13->mCameras = ppaVar18;
      if ((ulong)paVar13->mNumAnimations == 0) {
        local_250 = (aiAnimation **)0x0;
      }
      else {
        local_250 = (aiAnimation **)operator_new__((ulong)paVar13->mNumAnimations << 3);
      }
      paVar13->mAnimations = local_250;
      uVar22 = (int)((long)local_280.
                           super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_280.
                           super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x55555555;
      uVar30 = uVar22 - 1;
      if (-1 < (int)uVar30) {
        uVar29 = (ulong)uVar22;
        pcVar32 = (char *)(ulong)uVar30;
        do {
          pSVar21 = local_280.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          paVar5 = (local_280.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)pcVar32].scene)->mRootNode;
          if (pcVar32 ==
              (undefined1 *)
              (ulong)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)pcVar32]) {
            local_258 = paVar5;
            local_1d8[0] = paVar5;
            OffsetNodeMeshIndices
                      (paVar5,local_200.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[(long)pcVar32]);
          }
          else {
            Copy(local_1d8,paVar5);
            paVar5 = local_1d8[0];
            OffsetNodeMeshIndices
                      (local_1d8[0],
                       local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[(long)pcVar32]]);
            local_258 = paVar5;
            if ((flags & 4) != 0) {
              OffsetNodeMeshIndices
                        (paVar5,local_200.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[(long)pcVar32] -
                                local_200.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start
                                [local_238.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[(long)pcVar32]]);
            }
          }
          local_1c8._16_8_ = pcVar32 + -1;
          uVar22 = (uint)pcVar32;
          if (pcVar32 != (char *)0x0) {
            local_1a8.attachToNode =
                 (local_220->
                 super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start[(int)uVar29 - 2].attachToNode;
            local_1a8.node = local_258;
            local_1a8.resolved = false;
            local_1a8.src_idx._4_4_ = (undefined4)((ulong)pcVar32 >> 0x20);
            local_1a8.src_idx._0_4_ = uVar22;
            if (local_218.
                super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_218.
                super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::
              _M_realloc_insert<Assimp::NodeAttachmentInfo>
                        (&local_218,
                         (iterator)
                         local_218.
                         super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_1a8);
            }
            else {
              *(ulong *)&(local_218.
                          super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->resolved =
                   (ulong)(uint7)local_1a8._17_7_ << 8;
              (local_218.
               super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->src_idx = (size_t)pcVar32;
              (local_218.
               super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->node = local_258;
              (local_218.
               super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->attachToNode = local_1a8.attachToNode;
              local_218.
              super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_218.
                   super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          pSVar21 = pSVar21 + (long)pcVar32;
          local_248 = pcVar32;
          local_1e0 = ppaVar18;
          local_1b0 = uVar29;
          if ((flags & 1) == 0) {
            paVar13 = pSVar21->scene;
          }
          else {
            local_268 = pSVar21->id;
            if ((flags & 0x10) == 0) {
              AddNodePrefixes(local_258,local_268,pSVar21->idlen);
            }
            else {
              AddNodePrefixesChecked(local_258,local_268,pSVar21->idlen,&local_280,uVar22);
            }
            paVar13 = pSVar21->scene;
            if (paVar13->mNumMeshes != 0) {
              uVar29 = 0;
              do {
                paVar17 = paVar13->mMeshes[uVar29];
                if (paVar17->mNumBones != 0) {
                  uVar33 = 0;
                  do {
                    name = paVar17->mBones[uVar33];
                    if (((flags & 0x10) == 0) ||
                       (bVar10 = FindNameMatch(&name->mName,&local_280,(uint)local_248), bVar10)) {
                      uVar22 = pSVar21->idlen;
                      aVar2 = (name->mName).length;
                      if ((aVar2 == 0) || ((name->mName).data[0] != '$')) {
                        if (aVar2 + uVar22 < 0x3ff) {
                          pcVar32 = (name->mName).data;
                          memmove(pcVar32 + uVar22,pcVar32,(ulong)(aVar2 + 1));
                          memcpy(pcVar32,local_268,(ulong)uVar22);
                          (name->mName).length = (name->mName).length + uVar22;
                        }
                        else {
                          pLVar15 = DefaultLogger::get();
                          Logger::debug(pLVar15,
                                        "Can\'t add an unique prefix because the string is too long"
                                       );
                        }
                      }
                    }
                    uVar33 = uVar33 + 1;
                  } while (uVar33 < paVar17->mNumBones);
                  paVar13 = pSVar21->scene;
                  pcVar32 = local_248;
                }
                uVar29 = uVar29 + 1;
              } while (uVar29 < paVar13->mNumMeshes);
            }
          }
          ppaVar18 = local_1e0;
          if (paVar13->mNumLights != 0) {
            local_258 = (aiNode *)pSVar21->id;
            lVar38 = 0;
            uVar29 = 0;
            do {
              paVar6 = paVar13->mLights[uVar29];
              if (pcVar32 ==
                  (undefined1 *)
                  (ulong)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[(long)pcVar32]) {
                local_240[uVar29] = paVar6;
              }
              else if (((long)local_240 + lVar38 != 0) && (paVar6 != (aiLight *)0x0)) {
                __dest = (aiLight *)operator_new(0x46c);
                local_240[uVar29] = __dest;
                memcpy(__dest,paVar6,0x46c);
              }
              if (((flags & 1) != 0) &&
                 ((paVar6 = local_240[uVar29], (flags & 0x10) == 0 ||
                  (bVar10 = FindNameMatch(&paVar6->mName,&local_280,(uint)pcVar32), bVar10)))) {
                uVar22 = pSVar21->idlen;
                aVar2 = (paVar6->mName).length;
                if ((aVar2 == 0) || ((paVar6->mName).data[0] != '$')) {
                  if (aVar2 + uVar22 < 0x3ff) {
                    local_268 = (paVar6->mName).data;
                    memmove(local_268 + uVar22,local_268,(ulong)(aVar2 + 1));
                    memcpy(local_268,local_258,(ulong)uVar22);
                    (paVar6->mName).length = (paVar6->mName).length + uVar22;
                  }
                  else {
                    pLVar15 = DefaultLogger::get();
                    Logger::debug(pLVar15,
                                  "Can\'t add an unique prefix because the string is too long");
                  }
                }
              }
              uVar29 = uVar29 + 1;
              paVar13 = pSVar21->scene;
              lVar38 = lVar38 + 8;
            } while (uVar29 < paVar13->mNumLights);
            local_240 = (aiLight **)((long)local_240 + lVar38);
          }
          if (paVar13->mNumCameras != 0) {
            local_258 = (aiNode *)pSVar21->id;
            lVar38 = 0;
            uVar29 = 0;
            do {
              paVar7 = paVar13->mCameras[uVar29];
              if (pcVar32 ==
                  (undefined1 *)
                  (ulong)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[(long)pcVar32]) {
                ppaVar18[uVar29] = paVar7;
              }
              else if (((long)ppaVar18 + lVar38 != 0) && (paVar7 != (aiCamera *)0x0)) {
                __dest_00 = (aiCamera *)operator_new(0x438);
                ppaVar18[uVar29] = __dest_00;
                memcpy(__dest_00,paVar7,0x438);
              }
              if (((flags & 1) != 0) &&
                 ((paVar7 = ppaVar18[uVar29], (flags & 0x10) == 0 ||
                  (bVar10 = FindNameMatch(&paVar7->mName,&local_280,(uint)pcVar32), bVar10)))) {
                uVar22 = pSVar21->idlen;
                aVar2 = (paVar7->mName).length;
                if ((aVar2 == 0) || ((paVar7->mName).data[0] != '$')) {
                  if (aVar2 + uVar22 < 0x3ff) {
                    local_268 = (paVar7->mName).data;
                    memmove(local_268 + uVar22,local_268,(ulong)(aVar2 + 1));
                    memcpy(local_268,local_258,(ulong)uVar22);
                    (paVar7->mName).length = (paVar7->mName).length + uVar22;
                  }
                  else {
                    pLVar15 = DefaultLogger::get();
                    Logger::debug(pLVar15,
                                  "Can\'t add an unique prefix because the string is too long");
                  }
                }
              }
              uVar29 = uVar29 + 1;
              paVar13 = pSVar21->scene;
              lVar38 = lVar38 + 8;
            } while (uVar29 < paVar13->mNumCameras);
            ppaVar18 = (aiCamera **)((long)ppaVar18 + lVar38);
          }
          if (paVar13->mNumAnimations != 0) {
            local_268 = pSVar21->id;
            uVar29 = 0;
            do {
              if (local_248 ==
                  (undefined1 *)
                  (ulong)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[(long)local_248]) {
                *local_250 = paVar13->mAnimations[uVar29];
              }
              else {
                Copy(local_250,paVar13->mAnimations[uVar29]);
              }
              if (((flags & 1) != 0) &&
                 ((paVar19 = *local_250, (flags & 0x10) == 0 ||
                  (bVar10 = FindNameMatch(&paVar19->mName,&local_280,(uint)local_248), bVar10)))) {
                ppaVar37 = local_250;
                uVar22 = pSVar21->idlen;
                aVar2 = (paVar19->mName).length;
                if ((aVar2 == 0) || ((paVar19->mName).data[0] != '$')) {
                  if (aVar2 + uVar22 < 0x3ff) {
                    pcVar32 = (paVar19->mName).data;
                    memmove(pcVar32 + uVar22,pcVar32,(ulong)(aVar2 + 1));
                    memcpy(pcVar32,local_268,(ulong)uVar22);
                    (paVar19->mName).length = (paVar19->mName).length + uVar22;
                  }
                  else {
                    pLVar15 = DefaultLogger::get();
                    Logger::debug(pLVar15,
                                  "Can\'t add an unique prefix because the string is too long");
                  }
                }
                paVar19 = *ppaVar37;
                if (paVar19->mNumChannels != 0) {
                  uVar33 = 0;
                  do {
                    name_00 = paVar19->mChannels[uVar33];
                    if (((flags & 0x10) == 0) ||
                       (bVar10 = FindNameMatch(&name_00->mNodeName,&local_280,(uint)local_248),
                       bVar10)) {
                      uVar22 = pSVar21->idlen;
                      aVar2 = (name_00->mNodeName).length;
                      if ((aVar2 == 0) || ((name_00->mNodeName).data[0] != '$')) {
                        if (aVar2 + uVar22 < 0x3ff) {
                          pcVar32 = (name_00->mNodeName).data;
                          memmove(pcVar32 + uVar22,pcVar32,(ulong)(aVar2 + 1));
                          memcpy(pcVar32,local_268,(ulong)uVar22);
                          (name_00->mNodeName).length = (name_00->mNodeName).length + uVar22;
                        }
                        else {
                          pLVar15 = DefaultLogger::get();
                          Logger::debug(pLVar15,
                                        "Can\'t add an unique prefix because the string is too long"
                                       );
                        }
                      }
                    }
                    uVar33 = uVar33 + 1;
                    paVar19 = *local_250;
                  } while (uVar33 < paVar19->mNumChannels);
                }
              }
              uVar29 = uVar29 + 1;
              local_250 = local_250 + 1;
              paVar13 = pSVar21->scene;
            } while (uVar29 < paVar13->mNumAnimations);
          }
          uVar29 = local_1b0 - 1;
          paVar13 = local_260;
          pcVar32 = (char *)local_1c8._16_8_;
        } while (0 < (long)local_248);
      }
      AttachToGraph(local_1e8->mRootNode,&local_218);
      paVar13->mRootNode = local_1e8->mRootNode;
      if (local_218.
          super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_218.
          super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pNVar28 = local_218.
                  super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (pNVar28->resolved == false) {
            bVar11 = 0;
            if (((flags & 8) != 0) &&
               (local_280.
                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_280.
                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                _M_impl.super__Vector_impl_data._M_start)) {
              uVar22 = 1;
              uVar29 = 0;
              pSVar21 = local_280.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pSVar24 = local_280.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              do {
                if (pNVar28->src_idx != uVar29) {
                  AttachToGraph((pSVar21[uVar29].scene)->mRootNode,&local_218);
                  bVar11 = pNVar28->resolved;
                  pSVar21 = local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pSVar24 = local_280.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if ((bool)bVar11 != false) break;
                }
                uVar29 = (ulong)uVar22;
                uVar33 = ((long)pSVar24 - (long)pSVar21 >> 5) * -0x5555555555555555;
                uVar22 = uVar22 + 1;
              } while (uVar29 <= uVar33 && uVar33 - uVar29 != 0);
            }
            if ((bVar11 & 1) == 0) {
              pLVar15 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[45]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1a8,(char (*) [45])"SceneCombiner: Failed to resolve attachment ");
              pcVar32 = (pNVar28->node->mName).data;
              sVar20 = strlen(pcVar32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,pcVar32,sVar20);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
              pcVar32 = (pNVar28->attachToNode->mName).data;
              sVar20 = strlen(pcVar32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,pcVar32,sVar20);
              std::__cxx11::stringbuf::str();
              Logger::error(pLVar15,(char *)local_1d8[0]);
              if (local_1d8[0] != (aiNode *)local_1c8) {
                operator_delete(local_1d8[0],local_1c8._0_8_ + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              std::ios_base::~ios_base(local_138);
            }
          }
          pNVar28 = pNVar28 + 1;
        } while (pNVar28 !=
                 local_218.
                 super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_280.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_280.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar29 = 0;
        pSVar21 = local_280.
                  super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar24 = local_280.
                  super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        do {
          if ((uint)uVar29 ==
              local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar29]) {
            paVar13 = pSVar21[uVar29].scene;
            if (paVar13->mMeshes != (aiMesh **)0x0) {
              operator_delete__(paVar13->mMeshes);
            }
            paVar13->mMeshes = (aiMesh **)0x0;
            if (paVar13->mCameras != (aiCamera **)0x0) {
              operator_delete__(paVar13->mCameras);
            }
            paVar13->mCameras = (aiCamera **)0x0;
            if (paVar13->mLights != (aiLight **)0x0) {
              operator_delete__(paVar13->mLights);
            }
            paVar13->mLights = (aiLight **)0x0;
            if (paVar13->mMaterials != (aiMaterial **)0x0) {
              operator_delete__(paVar13->mMaterials);
            }
            paVar13->mMaterials = (aiMaterial **)0x0;
            if (paVar13->mAnimations != (aiAnimation **)0x0) {
              operator_delete__(paVar13->mAnimations);
            }
            paVar13->mAnimations = (aiAnimation **)0x0;
            paVar13->mRootNode = (aiNode *)0x0;
            aiScene::~aiScene(paVar13);
            operator_delete(paVar13,0x80);
            pSVar21 = local_280.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pSVar24 = local_280.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar29 = (ulong)((uint)uVar29 + 1);
          uVar33 = ((long)pSVar24 - (long)pSVar21 >> 5) * -0x5555555555555555;
        } while (uVar29 <= uVar33 && uVar33 - uVar29 != 0);
      }
      if ((local_260->mNumMeshes == 0) || (local_260->mNumMaterials == 0)) {
        *(byte *)&local_260->mFlags = (byte)local_260->mFlags | 1;
      }
      if (local_218.
          super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
          ._M_impl.super__Vector_impl_data._M_start != (NodeAttachmentInfo *)0x0) {
        operator_delete(local_218.
                        super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_218.
                              super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_218.
                              super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_200.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_200.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_238.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::~vector(&local_280);
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeScenes(aiScene** _dest, aiScene* master, std::vector<AttachmentInfo>& srcList, unsigned int flags) {
    if ( nullptr == _dest ) {
        return;
    }

    // if _dest points to NULL allocate a new scene. Otherwise clear the old and reuse it
    if (srcList.empty())    {
        if (*_dest) {
            SceneCombiner::CopySceneFlat(_dest,master);
        }
        else *_dest = master;
        return;
    }
    if (*_dest) {
        (*_dest)->~aiScene();
        new (*_dest) aiScene();
    }
    else *_dest = new aiScene();

    aiScene* dest = *_dest;

    std::vector<SceneHelper> src (srcList.size()+1);
    src[0].scene = master;
    for (unsigned int i = 0; i < srcList.size();++i)    {
        src[i+1] = SceneHelper( srcList[i].scene );
    }

    // this helper array specifies which scenes are duplicates of others
    std::vector<unsigned int> duplicates(src.size(),UINT_MAX);

    // this helper array is used as lookup table several times
    std::vector<unsigned int> offset(src.size());

    // Find duplicate scenes
    for (unsigned int i = 0; i < src.size();++i) {
        if (duplicates[i] != i && duplicates[i] != UINT_MAX) {
            continue;
        }

        duplicates[i] = i;
        for ( unsigned int a = i+1; a < src.size(); ++a)    {
            if (src[i].scene == src[a].scene) {
                duplicates[a] = i;
            }
        }
    }

    // Generate unique names for all named stuff?
    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES)
    {
#if 0
        // Construct a proper random number generator
        boost::mt19937 rng(  );
        boost::uniform_int<> dist(1u,1 << 24u);
        boost::variate_generator<boost::mt19937&, boost::uniform_int<> > rndGen(rng, dist);
#endif
        for (unsigned int i = 1; i < src.size();++i)
        {
            //if (i != duplicates[i])
            //{
            //  // duplicate scenes share the same UID
            //  ::strcpy( src[i].id, src[duplicates[i]].id );
            //  src[i].idlen = src[duplicates[i]].idlen;

            //  continue;
            //}

            src[i].idlen = ai_snprintf(src[i].id, 32, "$%.6X$_",i);

            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {

                // Compute hashes for all identifiers in this scene and store them
                // in a sorted table (for convenience I'm using std::set). We hash
                // just the node and animation channel names, all identifiers except
                // the material names should be caught by doing this.
                AddNodeHashes(src[i]->mRootNode,src[i].hashes);

                for (unsigned int a = 0; a < src[i]->mNumAnimations;++a) {
                    aiAnimation* anim = src[i]->mAnimations[a];
                    src[i].hashes.insert(SuperFastHash(anim->mName.data,static_cast<uint32_t>(anim->mName.length)));
                }
            }
        }
    }

    unsigned int cnt;

    // First find out how large the respective output arrays must be
    for ( unsigned int n = 0; n < src.size();++n )
    {
        SceneHelper* cur = &src[n];

        if (n == duplicates[n] || flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)   {
            dest->mNumTextures   += (*cur)->mNumTextures;
            dest->mNumMaterials  += (*cur)->mNumMaterials;
            dest->mNumMeshes     += (*cur)->mNumMeshes;
        }

        dest->mNumLights     += (*cur)->mNumLights;
        dest->mNumCameras    += (*cur)->mNumCameras;
        dest->mNumAnimations += (*cur)->mNumAnimations;

        // Combine the flags of all scenes
        // We need to process them flag-by-flag here to get correct results
        // dest->mFlags ; //|= (*cur)->mFlags;
        if ((*cur)->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
            dest->mFlags |= AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
        }
    }

    // generate the output texture list + an offset table for all texture indices
    if (dest->mNumTextures)
    {
        aiTexture** pip = dest->mTextures = new aiTexture*[dest->mNumMaterials];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )
        {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumTextures;++i)
            {
                if (n != duplicates[n])
                {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip,(*cur)->mTextures[i]);

                    else continue;
                }
                else *pip = (*cur)->mTextures[i];
                ++pip;
            }

            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mTextures);
        }
    }

    // generate the output material list + an offset table for all material indices
    if (dest->mNumMaterials)
    {
        aiMaterial** pip = dest->mMaterials = new aiMaterial*[dest->mNumMaterials];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )  {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumMaterials;++i)
            {
                if (n != duplicates[n])
                {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip,(*cur)->mMaterials[i]);

                    else continue;
                }
                else *pip = (*cur)->mMaterials[i];

                if ((*cur)->mNumTextures != dest->mNumTextures)     {
                    // We need to update all texture indices of the mesh. So we need to search for
                    // a material property called '$tex.file'

                    for (unsigned int a = 0; a < (*pip)->mNumProperties;++a)
                    {
                        aiMaterialProperty* prop = (*pip)->mProperties[a];
                        if (!strncmp(prop->mKey.data,"$tex.file",9))
                        {
                            // Check whether this texture is an embedded texture.
                            // In this case the property looks like this: *<n>,
                            // where n is the index of the texture.
                            aiString& s = *((aiString*)prop->mData);
                            if ('*' == s.data[0])   {
                                // Offset the index and write it back ..
                                const unsigned int idx = strtoul10(&s.data[1]) + offset[n];
                                ASSIMP_itoa10(&s.data[1],sizeof(s.data)-1,idx);
                            }
                        }

                        // Need to generate new, unique material names?
                        else if (!::strcmp( prop->mKey.data,"$mat.name" ) && flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_MATNAMES)
                        {
                            aiString* pcSrc = (aiString*) prop->mData;
                            PrefixString(*pcSrc, (*cur).id, (*cur).idlen);
                        }
                    }
                }
                ++pip;
            }

            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mMaterials);
        }
    }

    // generate the output mesh list + again an offset table for all mesh indices
    if (dest->mNumMeshes)
    {
        aiMesh** pip = dest->mMeshes = new aiMesh*[dest->mNumMeshes];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )
        {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumMeshes;++i)
            {
                if (n != duplicates[n]) {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip, (*cur)->mMeshes[i]);

                    else continue;
                }
                else *pip = (*cur)->mMeshes[i];

                // update the material index of the mesh
                (*pip)->mMaterialIndex +=  offset[n];
                ++pip;
            }

            // reuse the offset array - store now the mesh offset in it
            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mMeshes);
        }
    }

    std::vector <NodeAttachmentInfo> nodes;
    nodes.reserve(srcList.size());

    // ----------------------------------------------------------------------------
    // Now generate the output node graph. We need to make those
    // names in the graph that are referenced by anims or lights
    // or cameras unique. So we add a prefix to them ... $<rand>_
    // We could also use a counter, but using a random value allows us to
    // use just one prefix if we are joining multiple scene hierarchies recursively.
    // Chances are quite good we don't collide, so we try that ...
    // ----------------------------------------------------------------------------

    // Allocate space for light sources, cameras and animations
    aiLight** ppLights = dest->mLights = (dest->mNumLights
        ? new aiLight*[dest->mNumLights] : NULL);

    aiCamera** ppCameras = dest->mCameras = (dest->mNumCameras
        ? new aiCamera*[dest->mNumCameras] : NULL);

    aiAnimation** ppAnims = dest->mAnimations = (dest->mNumAnimations
        ? new aiAnimation*[dest->mNumAnimations] : NULL);

    for ( int n = static_cast<int>(src.size()-1); n >= 0 ;--n ) /* !!! important !!! */
    {
        SceneHelper* cur = &src[n];
        aiNode* node;

        // To offset or not to offset, this is the question
        if (n != (int)duplicates[n])
        {
            // Get full scene-graph copy
            Copy( &node, (*cur)->mRootNode );
            OffsetNodeMeshIndices(node,offset[duplicates[n]]);

            if (flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY) {
                // (note:) they are already 'offseted' by offset[duplicates[n]]
                OffsetNodeMeshIndices(node,offset[n] - offset[duplicates[n]]);
            }
        }
        else // if (n == duplicates[n])
        {
            node = (*cur)->mRootNode;
            OffsetNodeMeshIndices(node,offset[n]);
        }
        if (n) // src[0] is the master node
            nodes.push_back(NodeAttachmentInfo( node,srcList[n-1].attachToNode,n ));

        // add name prefixes?
        if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {

            // or the whole scenegraph
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                AddNodePrefixesChecked(node,(*cur).id,(*cur).idlen,src,n);
            }
            else AddNodePrefixes(node,(*cur).id,(*cur).idlen);

            // meshes
            for (unsigned int i = 0; i < (*cur)->mNumMeshes;++i)    {
                aiMesh* mesh = (*cur)->mMeshes[i];

                // rename all bones
                for (unsigned int a = 0; a < mesh->mNumBones;++a)   {
                    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                        if (!FindNameMatch(mesh->mBones[a]->mName,src,n))
                            continue;
                    }
                    PrefixString(mesh->mBones[a]->mName,(*cur).id,(*cur).idlen);
                }
            }
        }

        // --------------------------------------------------------------------
        // Copy light sources
        for (unsigned int i = 0; i < (*cur)->mNumLights;++i,++ppLights)
        {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppLights, (*cur)->mLights[i]);
            }
            else *ppLights = (*cur)->mLights[i];


            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppLights)->mName,src,n))
                        continue;
                }

                PrefixString((*ppLights)->mName,(*cur).id,(*cur).idlen);
            }
        }

        // --------------------------------------------------------------------
        // Copy cameras
        for (unsigned int i = 0; i < (*cur)->mNumCameras;++i,++ppCameras)   {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppCameras, (*cur)->mCameras[i]);
            }
            else *ppCameras = (*cur)->mCameras[i];

            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppCameras)->mName,src,n))
                        continue;
                }

                PrefixString((*ppCameras)->mName,(*cur).id,(*cur).idlen);
            }
        }

        // --------------------------------------------------------------------
        // Copy animations
        for (unsigned int i = 0; i < (*cur)->mNumAnimations;++i,++ppAnims)  {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppAnims, (*cur)->mAnimations[i]);
            }
            else *ppAnims = (*cur)->mAnimations[i];

            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppAnims)->mName,src,n))
                        continue;
                }

                PrefixString((*ppAnims)->mName,(*cur).id,(*cur).idlen);

                // don't forget to update all node animation channels
                for (unsigned int a = 0; a < (*ppAnims)->mNumChannels;++a) {
                    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                        if (!FindNameMatch((*ppAnims)->mChannels[a]->mNodeName,src,n))
                            continue;
                    }

                    PrefixString((*ppAnims)->mChannels[a]->mNodeName,(*cur).id,(*cur).idlen);
                }
            }
        }
    }

    // Now build the output graph
    AttachToGraph ( master, nodes);
    dest->mRootNode = master->mRootNode;

    // Check whether we succeeded at building the output graph
    for (std::vector <NodeAttachmentInfo> ::iterator it = nodes.begin();
        it != nodes.end(); ++it)
    {
        if (!(*it).resolved) {
            if (flags & AI_INT_MERGE_SCENE_RESOLVE_CROSS_ATTACHMENTS) {
                // search for this attachment point in all other imported scenes, too.
                for ( unsigned int n = 0; n < src.size();++n ) {
                    if (n != (*it).src_idx) {
                        AttachToGraph(src[n].scene,nodes);
                        if ((*it).resolved)
                            break;
                    }
                }
            }
            if (!(*it).resolved) {
                ASSIMP_LOG_ERROR_F( "SceneCombiner: Failed to resolve attachment ", (*it).node->mName.data,
                    " ", (*it).attachToNode->mName.data );
            }
        }
    }

    // now delete all input scenes. Make sure duplicate scenes aren't
    // deleted more than one time
    for ( unsigned int n = 0; n < src.size();++n )  {
        if (n != duplicates[n]) // duplicate scene?
            continue;

        aiScene* deleteMe = src[n].scene;

        // We need to delete the arrays before the destructor is called -
        // we are reusing the array members
        delete[] deleteMe->mMeshes;     deleteMe->mMeshes     = NULL;
        delete[] deleteMe->mCameras;    deleteMe->mCameras    = NULL;
        delete[] deleteMe->mLights;     deleteMe->mLights     = NULL;
        delete[] deleteMe->mMaterials;  deleteMe->mMaterials  = NULL;
        delete[] deleteMe->mAnimations; deleteMe->mAnimations = NULL;

        deleteMe->mRootNode = NULL;

        // Now we can safely delete the scene
        delete deleteMe;
    }

    // Check flags
    if (!dest->mNumMeshes || !dest->mNumMaterials) {
        dest->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }

    // We're finished
}